

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O0

void __thiscall Room::Room(Room *this,string *rn,ItemTable *itable,bool sld)

{
  allocator local_79;
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [55];
  byte local_21;
  ItemTable *pIStack_20;
  bool sld_local;
  ItemTable *itable_local;
  string *rn_local;
  Room *this_local;
  
  this->_vptr_Room = (_func_int **)&PTR___cxa_pure_virtual_00114da8;
  local_21 = sld;
  pIStack_20 = itable;
  itable_local = (ItemTable *)rn;
  rn_local = (string *)this;
  std::__cxx11::string::string((string *)&this->rstate0);
  std::__cxx11::string::string((string *)&this->rstate1);
  std::__cxx11::string::string((string *)&this->rstate2);
  std::__cxx11::string::string((string *)&this->rsdesc1);
  std::__cxx11::string::string((string *)&this->rsdesc2);
  std::__cxx11::string::string((string *)&this->rsdesc3);
  std::__cxx11::string::string((string *)&this->rsdesc4);
  std::__cxx11::string::string((string *)&this->roomName);
  std::__cxx11::string::string((string *)&this->displayName);
  this->table = pIStack_20;
  std::__cxx11::string::operator=((string *)&this->displayName,(string *)rn);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/originalname51[P]adventure_game/RoomDescriptions/"
             ,&local_79);
  std::operator+(local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78);
  std::__cxx11::string::operator=((string *)&this->roomName,(string *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  this->showLongDescription = (bool)(local_21 & 1);
  parseData(this);
  return;
}

Assistant:

Room::Room(std::string rn, ItemTable * itable, bool sld) {

    table = itable;
    displayName = rn;
    roomName = std::string(RESOURCES_PATH) + rn;
    showLongDescription = sld;
    parseData();
}